

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O3

void handleLinkCOMOptions(KinDynComputations *comp,parser *cmd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *psVar6;
  ostream *poVar7;
  long lVar8;
  string linkComName;
  string comFrameName;
  Transform frame_H_link;
  Position linkComWrtFrame;
  Position linkComWrtLink;
  long *local_120;
  long local_118;
  long local_110 [2];
  char *local_100;
  long local_f8;
  char local_f0;
  undefined7 uStack_ef;
  string local_e0 [3];
  long *local_80;
  long local_78;
  long local_70 [2];
  Transform local_60 [48];
  
  paVar1 = &local_e0[0].field_2;
  local_e0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"link-com","");
  bVar3 = cmdline::parser::exist(cmd,local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0[0]._M_dataplus._M_p,local_e0[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_e0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"link-com","");
    pbVar5 = cmdline::parser::get<std::__cxx11::string>(cmd,local_e0);
    pcVar2 = (pbVar5->_M_dataplus)._M_p;
    local_120 = local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar2,pcVar2 + pbVar5->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0[0]._M_dataplus._M_p,local_e0[0].field_2._M_allocated_capacity + 1);
    }
    local_f8 = 0;
    local_f0 = '\0';
    local_100 = &local_f0;
    local_e0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"link-com-frame","");
    bVar3 = cmdline::parser::exist(cmd,local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0[0]._M_dataplus._M_p,local_e0[0].field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_e0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"link-com-frame","");
      cmdline::parser::get<std::__cxx11::string>(cmd,local_e0);
      std::__cxx11::string::_M_assign((string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0[0]._M_dataplus._M_p,local_e0[0].field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_100);
    }
    iDynTree::KinDynComputations::getRelativeTransform((string *)local_e0,(string *)comp);
    psVar6 = (string *)iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::getLinkIndex(psVar6);
    cVar4 = iDynTree::Model::isValidLinkIndex((long)psVar6);
    if (cVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Link ",5);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_120,local_118);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," not found in the model",0x17);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    lVar8 = iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::getLink(lVar8);
    iDynTree::Link::getInertia();
    iDynTree::SpatialInertia::getCenterOfMass();
    iDynTree::Transform::operator*(local_60,(Position *)local_e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The COM of link ",0x10);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_120,local_118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," with respect to frame ",0x17);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_100,local_f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," is ",4);
    iDynTree::Position::toString_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_80,local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," m . ",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
    }
    if (local_120 != local_110) {
      operator_delete(local_120,local_110[0] + 1);
    }
  }
  return;
}

Assistant:

void handleLinkCOMOptions(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    using namespace iDynTree;

    if( !cmd.exist("link-com") )
    {
        return;
    }

    std::string linkComName = cmd.get<std::string>("link-com");

    std::string comFrameName;
    if( cmd.exist("link-com-frame") )
    {
        comFrameName = cmd.get<std::string>("link-com-frame");
    }
    else
    {
        comFrameName = linkComName;
    }

    Transform frame_H_link = comp.getRelativeTransform(comFrameName,linkComName);

    const Model & model = comp.getRobotModel();
    LinkIndex linkComIndex = model.getLinkIndex(linkComName);

    if( !model.isValidLinkIndex(linkComIndex) )
    {
        std::cerr << "Link " << linkComName << " not found in the model" <<  std::endl;
    }

    Position linkComWrtLink = comp.getRobotModel().getLink(linkComIndex)->getInertia().getCenterOfMass();

    Position linkComWrtFrame = frame_H_link*linkComWrtLink;

    std::cout << "The COM of link " << linkComName << " with respect to frame " << comFrameName
              << " is " << linkComWrtFrame.toString() << " m . " << std::endl;
}